

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::cpp_function<void,SomeClass,double>
          (cpp_function *this,offset_in_SomeClass_to_subr f)

{
  type local_20;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  local_20.f = f;
  initialize<pybind11::cpp_function::initialize<void,SomeClass,double>(void(SomeClass::*)(double))::_lambda(SomeClass*,double)_1_,void,SomeClass*,double>
            (this,&local_20,(_func_void_SomeClass_ptr_double *)0x0);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...), const Extra&... extra) {
        initialize([f](Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*) (Class *, Arg...)) nullptr, extra...);
    }